

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

iterator * __thiscall
ft::mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>::upper_bound
          (iterator *__return_storage_ptr__,
          mapBase<int,_int,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_> *this,
          key_type *k)

{
  rbtree *prVar1;
  treeNode<ft::pair<const_int,_int>_> *ptVar2;
  treeNode<ft::pair<const_int,_int>_> *ptVar3;
  treeNode<ft::pair<const_int,_int>_> *ptVar4;
  iterator *it;
  treeNode<ft::pair<const_int,_int>_> *ptVar5;
  treeNode<ft::pair<const_int,_int>_> *ptVar6;
  bool bVar7;
  
  prVar1 = &(this->
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ).m_tree;
  ptVar6 = ((this->
            super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
            ).m_tree.m_first)->parent;
  __return_storage_ptr__->_vptr_treeIterator = (_func_int **)&PTR__treeIterator_00113c70;
  __return_storage_ptr__->m_tree = prVar1;
  ptVar2 = (this->
           super_treeBase<int,_int,_ft::pair<const_int,_int>,_ft::less<int>,_ft::allocator<ft::pair<const_int,_int>_>_>
           ).m_tree.m_last;
  ptVar5 = ptVar2;
  if (ptVar6 != ptVar2) {
    ptVar3 = prVar1->NIL;
    do {
      ptVar5 = ptVar6;
      if (*k < (ptVar6->value).first) break;
      ptVar4 = ptVar6->right;
      if (ptVar6->right == ptVar3) {
        do {
          ptVar6 = ptVar5->parent;
          bVar7 = ptVar6->right == ptVar5;
          ptVar5 = ptVar6;
        } while (bVar7);
      }
      else {
        do {
          ptVar6 = ptVar4;
          ptVar4 = ptVar6->left;
        } while (ptVar6->left != ptVar3);
      }
      ptVar5 = ptVar2;
    } while (ptVar6 != ptVar2);
  }
  __return_storage_ptr__->m_node = ptVar5;
  return __return_storage_ptr__;
}

Assistant:

iterator		upper_bound(key_type const & k)
	{
		for (iterator it = this->begin(); it != this->end(); ++it)
		{
			if (this->key_comp()(k, it->first)) return it;
		}
		return this->end();
	}